

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  byte bVar1;
  pointer pbVar2;
  string *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  SystemInformationImplementation *this_00;
  char cVar8;
  long lVar9;
  size_type sVar10;
  string buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_string;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  string *local_70;
  vector<const_char_*,_std::allocator<const_char_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,arguments,(allocator<char> *)&local_c8);
  local_70 = __return_storage_ptr__;
  uVar4 = std::__cxx11::string::find((char)local_50,0x20);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      cVar8 = (char)local_50;
      uVar5 = std::__cxx11::string::find(cVar8,0x22);
      uVar6 = std::__cxx11::string::find(cVar8,0x22);
      if (uVar5 < uVar6 && uVar6 != 0xffffffffffffffff) {
        do {
          if (uVar5 < uVar4 && uVar4 < uVar6) goto LAB_003e4136;
          uVar5 = std::__cxx11::string::find(cVar8,0x22);
          uVar6 = std::__cxx11::string::find(cVar8,0x22);
        } while ((uVar5 < uVar6) && (uVar6 != 0xffffffffffffffff));
      }
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 &local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pbVar2 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var7._M_current =
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
      local_c8._M_dataplus._M_p._0_1_ = 0x22;
      _Var7 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var7,_Var7._M_current +
                               local_a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length,
                         (_Iter_equals_val<const_char>)&local_c8);
      pbVar2[-1]._M_string_length = (long)_Var7._M_current - (long)pbVar2[-1]._M_dataplus._M_p;
      *_Var7._M_current = '\0';
LAB_003e4136:
      uVar4 = std::__cxx11::string::find(cVar8,0x20);
    } while (uVar4 != 0xffffffffffffffff);
  }
  std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_88,
             ((long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 3);
  local_c8._M_dataplus._M_p = "kstat";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  local_c8._M_dataplus._M_p = "-p";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar4 = 0;
    do {
      local_c8._M_dataplus._M_p =
           *(pointer *)
            ((long)&((local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
      uVar4 = uVar4 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar4 < (ulong)((long)local_a8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_c8._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_88,(char **)&local_c8);
  this_00 = (SystemInformationImplementation *)local_88;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_68,(vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  psVar3 = local_70;
  RunProcess_abi_cxx11_(&local_c8,this_00,&local_68);
  if (local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar3->_M_string_length = 0;
  (psVar3->field_2)._M_local_buf[0] = '\0';
  sVar10 = local_c8._M_string_length;
LAB_003e42ad:
  while (sVar10 = sVar10 - 1, sVar10 != 0) {
    bVar1 = local_c8._M_dataplus._M_p[sVar10];
    if (0xc < bVar1) goto LAB_003e42ce;
    if (bVar1 != 10) {
      if (bVar1 != 9) goto LAB_003e42d8;
      break;
    }
  }
LAB_003e42ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return psVar3;
LAB_003e42ce:
  if (bVar1 != 0xd) {
    if (bVar1 == 0x20) goto LAB_003e42ec;
LAB_003e42d8:
    std::__cxx11::string::insert((ulong)psVar3,0,'\x01');
  }
  goto LAB_003e42ad;
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<std::string> args_string;
  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      args_string.push_back(command.substr(start + 1, pos - start - 1));
      std::string& arg = args_string.back();

      // Remove the quotes if any
      arg.erase(std::remove(arg.begin(), arg.end(), '"'), arg.end());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  args_string.push_back(command.substr(start + 1, command.size() - start - 1));

  std::vector<const char*> args;
  args.reserve(3 + args_string.size());
  args.push_back("kstat");
  args.push_back("-p");
  for (size_t i = 0; i < args_string.size(); ++i) {
    args.push_back(args_string[i].c_str());
  }
  args.push_back(KWSYS_NULLPTR);

  std::string buffer = this->RunProcess(args);

  std::string value;
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      value.insert(0u, 1, buffer[i]);
    }
  }
  return value;
}